

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  bool header;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  string local_d8;
  sigaction sa;
  
  progname = *argv;
  bVar1 = true;
  do {
    header = bVar1;
    iVar2 = getopt(argc,argv,"vhn");
    bVar1 = false;
  } while (iVar2 == 0x6e);
  if (iVar2 == -1) {
    memset(&sa,0,0x98);
    sigemptyset((sigset_t *)&sa.sa_mask);
    sa.__sigaction_handler.sa_handler = segfault_sigaction;
    sa.sa_flags = 4;
    sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
    std::__cxx11::string::string((string *)&local_d8,"",&local_f9);
    std::__cxx11::string::string((string *)&local_f8,"",&local_fa);
    initstreams(&local_d8,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    quantiletobin::doit(header);
    return 0;
  }
  if (iVar2 == 0x76) {
    fprintf(_stderr,"%s : version: %s\n",*argv,"");
  }
  else {
    help();
  }
  exit(1);
}

Assistant:

int main(int argc, char* argv[]) {

  progname = argv[0];
  int opt;
  bool header = true;

  while ((opt = getopt(argc, argv, "vhn")) != -1) {
    switch (opt) {
      case 'v':
	      fprintf(stderr, "%s : version: %s\n", argv[0], VERSION);
	      exit(EXIT_FAILURE);
	      break;
      case 'n':
	      header = false;
	      break;
      case 'h':
      default:
	      help();
	      exit(EXIT_FAILURE);
	      break;
    }
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = segfault_sigaction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {

    initstreams();
    quantiletobin::doit(header);
    return EXIT_SUCCESS;

  } catch (std::bad_alloc&) {

    fprintf(stderr, "%s: Memory allocation failed\n", progname);
    exit(EXIT_FAILURE);

  }

}